

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smart_ban.cpp
# Opt level: O2

shared_ptr<libtorrent::torrent_plugin>
libtorrent::create_smart_ban_plugin(torrent_handle *th,client_data_t param_2)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<libtorrent::torrent_plugin> sVar3;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::smart_ban_plugin,_std::allocator<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  torrent_handle::native_handle((torrent_handle *)&local_38);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_38._M_ptr);
  _Var2._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x60);
  (_Var2._M_pi)->_M_use_count = 1;
  (_Var2._M_pi)->_M_weak_count = 1;
  (_Var2._M_pi)->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_004d1540;
  _Var2._M_pi[1]._M_use_count = 0;
  _Var2._M_pi[1]._M_weak_count = 0;
  _Var2._M_pi[2]._vptr__Sp_counted_base = (_func_int **)0x0;
  _Var2._M_pi[1]._vptr__Sp_counted_base = (_func_int **)&PTR__smart_ban_plugin_004d1590;
  *(allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::smart_ban_plugin,_std::allocator<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_(__gnu_cxx::_Lock_policy)2>_>
    **)&_Var2._M_pi[2]._M_use_count = local_38._M_alloc;
  _Var2._M_pi[3]._M_use_count = 0;
  _Var2._M_pi[4]._vptr__Sp_counted_base = (_func_int **)0x0;
  *(_Atomic_word **)&_Var2._M_pi[4]._M_use_count = &_Var2._M_pi[3]._M_use_count;
  _Var2._M_pi[5]._vptr__Sp_counted_base = (_func_int **)&_Var2._M_pi[3]._M_use_count;
  _Var2._M_pi[5]._M_use_count = 0;
  _Var2._M_pi[5]._M_weak_count = 0;
  local_38._M_ptr = (pointer)0x0;
  peVar1 = (element_type *)(_Var2._M_pi + 1);
  _Stack_40._M_pi = _Var2._M_pi;
  local_38._M_alloc = &__a2;
  ::std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<libtorrent::(anonymous_namespace)::smart_ban_plugin,_std::allocator<libtorrent::(anonymous_namespace)::smart_ban_plugin>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  if ((_Var2._M_pi[2]._vptr__Sp_counted_base == (_func_int **)0x0) ||
     (*(int *)(_Var2._M_pi[2]._vptr__Sp_counted_base + 1) == 0)) {
    *(element_type **)&_Var2._M_pi[1]._M_use_count = peVar1;
    ::std::__weak_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__weak_count<(__gnu_cxx::_Lock_policy)2> *)(_Var2._M_pi + 2),&_Stack_40);
    _Var2._M_pi = _Stack_40._M_pi;
  }
  _Stack_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       peVar1;
  (th->m_torrent).super___weak_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_refcount
  ._M_pi = _Var2._M_pi;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_40);
  sVar3.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = extraout_RDX._M_pi;
  sVar3.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)th;
  return (shared_ptr<libtorrent::torrent_plugin>)
         sVar3.super___shared_ptr<libtorrent::torrent_plugin,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<torrent_plugin> create_smart_ban_plugin(torrent_handle const& th, client_data_t)
	{
		aux::torrent* t = th.native_handle().get();
		return std::make_shared<smart_ban_plugin>(*t);
	}